

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Triple.cpp
# Opt level: O3

string * llvm::Triple::normalize_abi_cxx11_(StringRef Str)

{
  uint *puVar1;
  ulong __n;
  char *pcVar2;
  size_t sVar3;
  long *plVar4;
  void *pvVar5;
  _Alloc_hider _Var6;
  size_type sVar7;
  ArchType AVar8;
  VendorType VVar9;
  EnvironmentType EVar10;
  ObjectFormatType OVar11;
  uint uVar12;
  int iVar13;
  OSType OVar14;
  char cVar15;
  uint uVar16;
  size_t sVar17;
  char *pcVar18;
  uint e;
  ulong uVar19;
  string *in_RDI;
  long lVar20;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  bool bVar24;
  bool bVar25;
  StringRef SVar26;
  StringRef SVar27;
  StringRef ArchName;
  StringRef OSName;
  StringRef EnvironmentName;
  StringRef VendorName;
  bool Found [4];
  string *Normalized;
  SmallVector<llvm::StringRef,_4U> Components;
  StringRef CurrentComponent;
  string NormalizedEnvironment;
  StringRef AndroidVersion;
  ObjectFormatType local_11c;
  bool local_114 [4];
  uint local_110;
  EnvironmentType local_10c;
  OSType local_108;
  VendorType local_104;
  string *local_100;
  SmallVectorImpl<llvm::StringRef> local_f8;
  StringRef local_e8 [4];
  string local_a8;
  char *local_88;
  size_t sStack_80;
  char local_78;
  undefined7 uStack_77;
  StringRef local_68;
  StringRef local_58;
  Twine local_48;
  
  local_f8.super_SmallVectorTemplateBase<llvm::StringRef,_true>.
  super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.BeginX = local_e8;
  local_f8.super_SmallVectorTemplateBase<llvm::StringRef,_true>.
  super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.Size = 0;
  local_f8.super_SmallVectorTemplateBase<llvm::StringRef,_true>.
  super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.Capacity = 4;
  local_100 = in_RDI;
  StringRef::split(&local_58,&local_f8,'-',-1,true);
  if (local_f8.super_SmallVectorTemplateBase<llvm::StringRef,_true>.
      super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.Size == 0) {
    bVar24 = false;
    uVar19 = 0;
  }
  else {
    AVar8 = parseArch(*local_f8.super_SmallVectorTemplateBase<llvm::StringRef,_true>.
                       super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.
                       BeginX);
    pvVar5 = local_f8.super_SmallVectorTemplateBase<llvm::StringRef,_true>.
             super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.BeginX;
    bVar24 = AVar8 != UnknownArch;
    uVar12 = local_f8.super_SmallVectorTemplateBase<llvm::StringRef,_true>.
             super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.Size;
    uVar19 = local_f8.super_SmallVectorTemplateBase<llvm::StringRef,_true>.
             super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase._8_8_ &
             0xffffffff;
    if (1 < local_f8.super_SmallVectorTemplateBase<llvm::StringRef,_true>.
            super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.Size) {
      VVar9 = parseVendor(*(StringRef *)
                           ((long)local_f8.super_SmallVectorTemplateBase<llvm::StringRef,_true>.
                                  super_SmallVectorTemplateCommon<llvm::StringRef,_void>.
                                  super_SmallVectorBase.BeginX + 0x10));
      local_11c = UnknownObjectFormat;
      if (uVar12 == 2) {
        uVar19 = 2;
        local_10c = UnknownEnvironment;
        OVar14 = UnknownOS;
        local_110 = 0;
        bVar25 = false;
        goto LAB_001692ab;
      }
      puVar1 = (uint *)((StringRef *)((long)pvVar5 + 0x20))->Data;
      uVar21 = ((StringRef *)((long)pvVar5 + 0x20))->Length;
      OVar14 = parseOS(*(StringRef *)((long)pvVar5 + 0x20));
      if (uVar21 < 6) {
        local_110 = 0;
        bVar25 = false;
        if (uVar21 == 5) goto LAB_00169a57;
      }
      else {
        uVar16 = (ushort)puVar1[1] ^ 0x6e69 | *puVar1 ^ 0x77677963;
        local_110 = CONCAT31((int3)(uVar16 >> 8),uVar16 == 0);
LAB_00169a57:
        bVar25 = (char)puVar1[1] == 'w' && *puVar1 == 0x676e696d;
      }
      if (uVar12 < 4) {
        uVar19 = 3;
        local_10c = UnknownEnvironment;
      }
      else {
        local_10c = parseEnvironment(*(StringRef *)((long)pvVar5 + 0x30));
        if (uVar12 == 4) {
          uVar19 = 4;
        }
        else {
          local_11c = parseFormat(*(StringRef *)((long)pvVar5 + 0x40));
        }
      }
      goto LAB_001692ab;
    }
  }
  local_10c = UnknownEnvironment;
  VVar9 = UnknownVendor;
  OVar14 = UnknownOS;
  local_110 = 0;
  bVar25 = false;
  local_11c = UnknownObjectFormat;
LAB_001692ab:
  local_114[0] = bVar24;
  local_114[1] = VVar9 != UnknownVendor;
  local_114[2] = OVar14 != UnknownOS;
  local_114[3] = local_10c != UnknownEnvironment;
  uVar21 = 0;
  local_104 = VVar9;
  local_108 = OVar14;
LAB_001692ce:
  if ((local_114[uVar21] == false) && ((int)uVar19 != 0)) {
    lVar20 = 8;
    uVar22 = 0;
    do {
      uVar12 = (uint)uVar22;
      if ((3 < uVar12) || (local_114[uVar22] == false)) {
        if ((uint)uVar19 <= uVar12) goto LAB_00169ad2;
        if (3 < (uint)uVar21) {
          llvm_unreachable_internal
                    ("unexpected component type!",
                     "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/Triple.cpp"
                     ,0x329);
        }
        puVar1 = *(uint **)((long)local_f8.super_SmallVectorTemplateBase<llvm::StringRef,_true>.
                                  super_SmallVectorTemplateCommon<llvm::StringRef,_void>.
                                  super_SmallVectorBase.BeginX + lVar20 + -8);
        __n = *(ulong *)((long)(char **)local_f8.
                                        super_SmallVectorTemplateBase<llvm::StringRef,_true>.
                                        super_SmallVectorTemplateCommon<llvm::StringRef,_void>.
                                        super_SmallVectorBase.BeginX + lVar20);
        switch(uVar21 & 0xffffffff) {
        case 0:
          ArchName.Length = __n;
          ArchName.Data = (char *)puVar1;
          AVar8 = parseArch(ArchName);
          if (AVar8 == UnknownArch) {
            uVar19 = local_f8.super_SmallVectorTemplateBase<llvm::StringRef,_true>.
                     super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.
                     _8_8_ & 0xffffffff;
            goto LAB_00169439;
          }
          break;
        case 1:
          VendorName.Length = __n;
          VendorName.Data = (char *)puVar1;
          local_104 = parseVendor(VendorName);
          if (local_104 == UnknownVendor) {
            local_104 = UnknownVendor;
            goto LAB_00169439;
          }
          break;
        case 2:
          OSName.Length = __n;
          OSName.Data = (char *)puVar1;
          local_108 = parseOS(OSName);
          if (__n < 6) {
            local_110 = 0;
            cVar15 = '\0';
            bVar25 = false;
            if (__n == 5) goto LAB_00169401;
          }
          else {
            local_110 = CONCAT31((int3)((*puVar1 ^ 0x77677963) >> 8),
                                 (short)puVar1[1] == 0x6e69 && (*puVar1 ^ 0x77677963) == 0);
LAB_00169401:
            bVar25 = (char)puVar1[1] == 'w' && *puVar1 == 0x676e696d;
            cVar15 = (char)local_110;
          }
          if (((local_108 == UnknownOS) && (cVar15 == '\0')) && (!bVar25)) {
            local_108 = UnknownOS;
            goto LAB_00169439;
          }
          break;
        case 3:
          SVar27.Length = __n;
          SVar27.Data = (char *)puVar1;
          EVar10 = parseEnvironment(SVar27);
          if (EVar10 == UnknownEnvironment) {
            EnvironmentName.Length = __n;
            EnvironmentName.Data = (char *)puVar1;
            OVar11 = parseFormat(EnvironmentName);
            local_11c = UnknownObjectFormat;
            if (OVar11 == UnknownObjectFormat) {
              local_10c = UnknownEnvironment;
              goto LAB_00169439;
            }
            local_10c = UnknownEnvironment;
            local_11c = OVar11;
          }
          else {
            local_10c = EVar10;
          }
        }
        uVar19 = uVar22;
        if (uVar22 <= uVar21) goto joined_r0x00169508;
        if (local_f8.super_SmallVectorTemplateBase<llvm::StringRef,_true>.
            super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.Size <=
            uVar12) goto LAB_00169ad2;
        pcVar18 = *(char **)((long)local_f8.super_SmallVectorTemplateBase<llvm::StringRef,_true>.
                                   super_SmallVectorTemplateCommon<llvm::StringRef,_void>.
                                   super_SmallVectorBase.BeginX + lVar20 + -8);
        sVar17 = *(size_t *)
                  ((long)(char **)local_f8.super_SmallVectorTemplateBase<llvm::StringRef,_true>.
                                  super_SmallVectorTemplateCommon<llvm::StringRef,_void>.
                                  super_SmallVectorBase.BeginX + lVar20);
        *(char **)((long)local_f8.super_SmallVectorTemplateBase<llvm::StringRef,_true>.
                         super_SmallVectorTemplateCommon<llvm::StringRef,_void>.
                         super_SmallVectorBase.BeginX + lVar20 + -8) = "";
        *(undefined8 *)
         ((long)(char **)local_f8.super_SmallVectorTemplateBase<llvm::StringRef,_true>.
                         super_SmallVectorTemplateCommon<llvm::StringRef,_void>.
                         super_SmallVectorBase.BeginX + lVar20) = 0;
        if (sVar17 == 0) goto LAB_001695df;
        uVar19 = uVar21 & 0xffffffff;
        goto LAB_001694a0;
      }
LAB_00169439:
      lVar20 = lVar20 + 0x10;
      uVar22 = uVar22 + 1;
    } while ((int)uVar22 != (int)uVar19);
  }
  goto LAB_00169629;
joined_r0x00169508:
  while (uVar23 = uVar19, uVar22 < uVar21) {
    local_a8._M_dataplus._M_p = "";
    local_a8._M_string_length = 0;
    uVar12 = (uint)uVar23;
    if (uVar12 < local_f8.super_SmallVectorTemplateBase<llvm::StringRef,_true>.
                 super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.Size)
    {
      uVar19 = uVar23 & 0xffffffff;
      do {
        sVar7 = local_a8._M_string_length;
        _Var6._M_p = local_a8._M_dataplus._M_p;
        local_88 = local_a8._M_dataplus._M_p;
        sStack_80 = local_a8._M_string_length;
        sVar17 = ((StringRef *)
                 ((long)local_f8.super_SmallVectorTemplateBase<llvm::StringRef,_true>.
                        super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase
                        .BeginX + uVar19 * 0x10))->Length;
        local_a8._M_dataplus._M_p =
             ((StringRef *)
             ((long)local_f8.super_SmallVectorTemplateBase<llvm::StringRef,_true>.
                    super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.
                    BeginX + uVar19 * 0x10))->Data;
        local_a8._M_string_length = sVar17;
        ((StringRef *)
        ((long)local_f8.super_SmallVectorTemplateBase<llvm::StringRef,_true>.
               super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.BeginX +
        uVar19 * 0x10))->Data = _Var6._M_p;
        ((StringRef *)
        ((long)local_f8.super_SmallVectorTemplateBase<llvm::StringRef,_true>.
               super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.BeginX +
        uVar19 * 0x10))->Length = sVar7;
        if (sVar17 == 0) goto LAB_001695a7;
        uVar16 = 3;
        if (3 < (uint)uVar19) {
          uVar16 = (uint)uVar19;
        }
        do {
          if (uVar16 == (uint)uVar19) {
            uVar19 = (ulong)(uVar16 + 1);
            break;
          }
          uVar19 = (ulong)((uint)uVar19 + 1);
        } while (local_114[uVar19] != false);
      } while ((uint)uVar19 <
               local_f8.super_SmallVectorTemplateBase<llvm::StringRef,_true>.
               super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.Size);
      if (uVar12 < local_f8.super_SmallVectorTemplateBase<llvm::StringRef,_true>.
                   super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.Size
         ) {
        SmallVectorTemplateBase<llvm::StringRef,_true>::push_back
                  (&local_f8.super_SmallVectorTemplateBase<llvm::StringRef,_true>,
                   (StringRef *)&local_a8);
      }
    }
LAB_001695a7:
    uVar12 = uVar12 + 1;
    if (uVar12 < 5) {
      uVar12 = 4;
    }
    do {
      if (uVar12 - 1 == (int)uVar23) {
        uVar23 = (ulong)uVar12;
        uVar16 = uVar12;
        break;
      }
      uVar16 = (int)uVar23 + 1;
      uVar23 = (ulong)uVar16;
    } while (local_114[uVar23] != false);
    uVar19 = (ulong)uVar16;
    uVar22 = uVar23;
  }
  goto LAB_001695df;
  while( true ) {
    pcVar2 = ((StringRef *)
             ((long)local_f8.super_SmallVectorTemplateBase<llvm::StringRef,_true>.
                    super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.
                    BeginX + uVar19 * 0x10))->Data;
    sVar3 = ((StringRef *)
            ((long)local_f8.super_SmallVectorTemplateBase<llvm::StringRef,_true>.
                   super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.
                   BeginX + uVar19 * 0x10))->Length;
    ((StringRef *)
    ((long)local_f8.super_SmallVectorTemplateBase<llvm::StringRef,_true>.
           super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.BeginX +
    uVar19 * 0x10))->Data = pcVar18;
    ((StringRef *)
    ((long)local_f8.super_SmallVectorTemplateBase<llvm::StringRef,_true>.
           super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.BeginX +
    uVar19 * 0x10))->Length = sVar17;
    uVar19 = (ulong)(uVar12 + 1);
    sVar17 = sVar3;
    pcVar18 = pcVar2;
    if (sVar3 == 0) break;
LAB_001694a0:
    uVar12 = (uint)uVar19;
    if (uVar12 < 4) {
      lVar20 = (3 - uVar12) + uVar19;
      do {
        if (local_114[uVar19] != true) {
          uVar12 = (uint)uVar19;
          goto LAB_001694d3;
        }
        uVar19 = uVar19 + 1;
      } while (uVar19 != 4);
      uVar12 = 4;
      uVar19 = lVar20 + 1;
    }
LAB_001694d3:
    if (local_f8.super_SmallVectorTemplateBase<llvm::StringRef,_true>.
        super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.Size <= uVar12)
    goto LAB_00169ad2;
  }
LAB_001695df:
  uVar19 = local_f8.super_SmallVectorTemplateBase<llvm::StringRef,_true>.
           super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase._8_8_ &
           0xffffffff;
  if (((uVar19 <= uVar21) ||
      (((StringRef *)
       ((long)local_f8.super_SmallVectorTemplateBase<llvm::StringRef,_true>.
              super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.BeginX +
       uVar21 * 0x10))->Length != __n)) ||
     ((__n != 0 &&
      (iVar13 = bcmp(((StringRef *)
                     ((long)local_f8.super_SmallVectorTemplateBase<llvm::StringRef,_true>.
                            super_SmallVectorTemplateCommon<llvm::StringRef,_void>.
                            super_SmallVectorBase.BeginX + uVar21 * 0x10))->Data,puVar1,__n),
      iVar13 != 0)))) {
    __assert_fail("Pos < Components.size() && Components[Pos] == Comp && \"Component moved wrong!\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/Triple.cpp"
                  ,0x374,"static std::string llvm::Triple::normalize(StringRef)");
  }
  local_114[uVar21] = true;
LAB_00169629:
  OVar14 = local_108;
  uVar21 = uVar21 + 1;
  if (uVar21 == 4) goto LAB_00169651;
  goto LAB_001692ce;
LAB_00169651:
  sStack_80 = 0;
  local_78 = '\0';
  local_88 = &local_78;
  if (local_10c == Android) {
    if ((uint)uVar19 < 4) goto LAB_00169ad2;
    if ((10 < ((StringRef *)
              ((long)local_f8.super_SmallVectorTemplateBase<llvm::StringRef,_true>.
                     super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.
                     BeginX + 0x30))->Length) &&
       (plVar4 = (long *)((StringRef *)
                         ((long)local_f8.super_SmallVectorTemplateBase<llvm::StringRef,_true>.
                                super_SmallVectorTemplateCommon<llvm::StringRef,_void>.
                                super_SmallVectorBase.BeginX + 0x30))->Data,
       *(long *)((long)plVar4 + 3) == 0x6962616564696f72 && *plVar4 == 0x6564696f72646e61)) {
      local_68.Data = (char *)((long)plVar4 + 0xb);
      local_68.Length =
           ((StringRef *)
           ((long)local_f8.super_SmallVectorTemplateBase<llvm::StringRef,_true>.
                  super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.
                  BeginX + 0x30))->Length - 0xb;
      if (local_68.Length == 0) {
        ((StringRef *)
        ((long)local_f8.super_SmallVectorTemplateBase<llvm::StringRef,_true>.
               super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.BeginX +
        0x30))->Data = "android";
        ((StringRef *)
        ((long)local_f8.super_SmallVectorTemplateBase<llvm::StringRef,_true>.
               super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.BeginX +
        0x30))->Length = 7;
      }
      else {
        Twine::Twine(&local_48,"android",&local_68);
        Twine::str_abi_cxx11_(&local_a8,&local_48);
        std::__cxx11::string::operator=((string *)&local_88,(string *)&local_a8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
          operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
        }
        sVar17 = sStack_80;
        uVar19 = local_f8.super_SmallVectorTemplateBase<llvm::StringRef,_true>.
                 super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase._8_8_
                 & 0xffffffff;
        if (local_f8.super_SmallVectorTemplateBase<llvm::StringRef,_true>.
            super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.Size < 4)
        goto LAB_00169ad2;
        ((StringRef *)
        ((long)local_f8.super_SmallVectorTemplateBase<llvm::StringRef,_true>.
               super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.BeginX +
        0x30))->Data = local_88;
        ((StringRef *)
        ((long)local_f8.super_SmallVectorTemplateBase<llvm::StringRef,_true>.
               super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.BeginX +
        0x30))->Length = sVar17;
      }
    }
  }
  else if ((local_104 == SUSE) && (local_10c == GNUEABI)) {
    if ((uint)uVar19 < 4) goto LAB_00169ad2;
    ((StringRef *)
    ((long)local_f8.super_SmallVectorTemplateBase<llvm::StringRef,_true>.
           super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.BeginX +
    0x30))->Data = "gnueabihf";
    ((StringRef *)
    ((long)local_f8.super_SmallVectorTemplateBase<llvm::StringRef,_true>.
           super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.BeginX +
    0x30))->Length = 9;
  }
  if (OVar14 == Win32) {
    SmallVectorImpl<llvm::StringRef>::resize(&local_f8,4);
    uVar19 = local_f8.super_SmallVectorTemplateBase<llvm::StringRef,_true>.
             super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase._8_8_ &
             0xffffffff;
    if (local_f8.super_SmallVectorTemplateBase<llvm::StringRef,_true>.
        super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.Size < 3)
    goto LAB_00169ad2;
    ((StringRef *)
    ((long)local_f8.super_SmallVectorTemplateBase<llvm::StringRef,_true>.
           super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.BeginX +
    0x20))->Data = "windows";
    ((StringRef *)
    ((long)local_f8.super_SmallVectorTemplateBase<llvm::StringRef,_true>.
           super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.BeginX +
    0x20))->Length = 7;
    if (local_10c == UnknownEnvironment) {
      if (local_11c < ELF) {
        if (local_f8.super_SmallVectorTemplateBase<llvm::StringRef,_true>.
            super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.Size == 3)
        goto LAB_00169ad2;
        SVar26.Length = 4;
        SVar26.Data = "msvc";
      }
      else {
        SVar26 = getObjectFormatTypeName(local_11c);
        uVar19 = local_f8.super_SmallVectorTemplateBase<llvm::StringRef,_true>.
                 super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase._8_8_
                 & 0xffffffff;
        if (local_f8.super_SmallVectorTemplateBase<llvm::StringRef,_true>.
            super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.Size < 4)
        goto LAB_00169ad2;
      }
      goto LAB_001698f9;
    }
  }
  else {
    if (bVar25) {
      SmallVectorImpl<llvm::StringRef>::resize(&local_f8,4);
      uVar19 = local_f8.super_SmallVectorTemplateBase<llvm::StringRef,_true>.
               super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase._8_8_ &
               0xffffffff;
      if (local_f8.super_SmallVectorTemplateBase<llvm::StringRef,_true>.
          super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.Size < 3)
      goto LAB_00169ad2;
      ((StringRef *)
      ((long)local_f8.super_SmallVectorTemplateBase<llvm::StringRef,_true>.
             super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.BeginX +
      0x20))->Data = "windows";
      ((StringRef *)
      ((long)local_f8.super_SmallVectorTemplateBase<llvm::StringRef,_true>.
             super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.BeginX +
      0x20))->Length = 7;
      if (local_f8.super_SmallVectorTemplateBase<llvm::StringRef,_true>.
          super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.Size == 3)
      goto LAB_00169ad2;
      SVar26.Length = 3;
      SVar26.Data = "gnu";
    }
    else {
      if ((local_110 & 1) == 0) goto LAB_00169901;
      SmallVectorImpl<llvm::StringRef>::resize(&local_f8,4);
      uVar19 = local_f8.super_SmallVectorTemplateBase<llvm::StringRef,_true>.
               super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase._8_8_ &
               0xffffffff;
      if (local_f8.super_SmallVectorTemplateBase<llvm::StringRef,_true>.
          super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.Size < 3)
      goto LAB_00169ad2;
      ((StringRef *)
      ((long)local_f8.super_SmallVectorTemplateBase<llvm::StringRef,_true>.
             super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.BeginX +
      0x20))->Data = "windows";
      ((StringRef *)
      ((long)local_f8.super_SmallVectorTemplateBase<llvm::StringRef,_true>.
             super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.BeginX +
      0x20))->Length = 7;
      if (local_f8.super_SmallVectorTemplateBase<llvm::StringRef,_true>.
          super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.Size == 3)
      goto LAB_00169ad2;
      SVar26.Length = 6;
      SVar26.Data = "cygnus";
    }
LAB_001698f9:
    *(StringRef *)
     ((long)local_f8.super_SmallVectorTemplateBase<llvm::StringRef,_true>.
            super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.BeginX +
     0x30) = SVar26;
  }
LAB_00169901:
  if (bVar25) {
    if (local_11c < ELF) goto LAB_00169988;
LAB_0016993b:
    SmallVectorImpl<llvm::StringRef>::resize(&local_f8,5);
    SVar27 = getObjectFormatTypeName(local_11c);
    uVar19 = local_f8.super_SmallVectorTemplateBase<llvm::StringRef,_true>.
             super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase._8_8_ &
             0xffffffff;
    if (local_f8.super_SmallVectorTemplateBase<llvm::StringRef,_true>.
        super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.Size < 5) {
LAB_00169ad2:
      __assert_fail("idx < size()",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/SmallVector.h"
                    ,0x9b,
                    "reference llvm::SmallVectorTemplateCommon<llvm::StringRef>::operator[](size_type) [T = llvm::StringRef]"
                   );
    }
    *(StringRef *)
     ((long)local_f8.super_SmallVectorTemplateBase<llvm::StringRef,_true>.
            super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.BeginX +
     0x40) = SVar27;
    (local_100->_M_dataplus)._M_p = (pointer)&local_100->field_2;
    local_100->_M_string_length = 0;
    (local_100->field_2)._M_local_buf[0] = '\0';
  }
  else {
    if (((local_110 & 1) != 0 || local_10c != UnknownEnvironment && OVar14 == Win32) &&
       (COFF < local_11c)) goto LAB_0016993b;
LAB_00169988:
    (local_100->_M_dataplus)._M_p = (pointer)&local_100->field_2;
    local_100->_M_string_length = 0;
    (local_100->field_2)._M_local_buf[0] = '\0';
    if ((int)uVar19 == 0) goto LAB_001699f5;
  }
  lVar20 = 8;
  uVar21 = 0;
  do {
    if (lVar20 != 8) {
      std::__cxx11::string::push_back((char)local_100);
    }
    if ((local_f8.super_SmallVectorTemplateBase<llvm::StringRef,_true>.
         super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase._8_8_ &
        0xffffffff) <= uVar21) goto LAB_00169ad2;
    std::__cxx11::string::append
              ((char *)local_100,
               *(ulong *)((long)local_f8.super_SmallVectorTemplateBase<llvm::StringRef,_true>.
                                super_SmallVectorTemplateCommon<llvm::StringRef,_void>.
                                super_SmallVectorBase.BeginX + lVar20 + -8));
    uVar21 = uVar21 + 1;
    lVar20 = lVar20 + 0x10;
  } while (uVar19 != uVar21);
LAB_001699f5:
  if (local_88 != &local_78) {
    operator_delete(local_88,CONCAT71(uStack_77,local_78) + 1);
  }
  if ((StringRef *)
      local_f8.super_SmallVectorTemplateBase<llvm::StringRef,_true>.
      super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.BeginX !=
      local_e8) {
    free(local_f8.super_SmallVectorTemplateBase<llvm::StringRef,_true>.
         super_SmallVectorTemplateCommon<llvm::StringRef,_void>.super_SmallVectorBase.BeginX);
  }
  return local_100;
}

Assistant:

std::string Triple::normalize(StringRef Str) {
  bool IsMinGW32 = false;
  bool IsCygwin = false;

  // Parse into components.
  SmallVector<StringRef, 4> Components;
  Str.split(Components, '-');

  // If the first component corresponds to a known architecture, preferentially
  // use it for the architecture.  If the second component corresponds to a
  // known vendor, preferentially use it for the vendor, etc.  This avoids silly
  // component movement when a component parses as (eg) both a valid arch and a
  // valid os.
  ArchType Arch = UnknownArch;
  if (Components.size() > 0)
    Arch = parseArch(Components[0]);
  VendorType Vendor = UnknownVendor;
  if (Components.size() > 1)
    Vendor = parseVendor(Components[1]);
  OSType OS = UnknownOS;
  if (Components.size() > 2) {
    OS = parseOS(Components[2]);
    IsCygwin = Components[2].startswith("cygwin");
    IsMinGW32 = Components[2].startswith("mingw");
  }
  EnvironmentType Environment = UnknownEnvironment;
  if (Components.size() > 3)
    Environment = parseEnvironment(Components[3]);
  ObjectFormatType ObjectFormat = UnknownObjectFormat;
  if (Components.size() > 4)
    ObjectFormat = parseFormat(Components[4]);

  // Note which components are already in their final position.  These will not
  // be moved.
  bool Found[4];
  Found[0] = Arch != UnknownArch;
  Found[1] = Vendor != UnknownVendor;
  Found[2] = OS != UnknownOS;
  Found[3] = Environment != UnknownEnvironment;

  // If they are not there already, permute the components into their canonical
  // positions by seeing if they parse as a valid architecture, and if so moving
  // the component to the architecture position etc.
  for (unsigned Pos = 0; Pos != array_lengthof(Found); ++Pos) {
    if (Found[Pos])
      continue; // Already in the canonical position.

    for (unsigned Idx = 0; Idx != Components.size(); ++Idx) {
      // Do not reparse any components that already matched.
      if (Idx < array_lengthof(Found) && Found[Idx])
        continue;

      // Does this component parse as valid for the target position?
      bool Valid = false;
      StringRef Comp = Components[Idx];
      switch (Pos) {
      default: llvm_unreachable("unexpected component type!");
      case 0:
        Arch = parseArch(Comp);
        Valid = Arch != UnknownArch;
        break;
      case 1:
        Vendor = parseVendor(Comp);
        Valid = Vendor != UnknownVendor;
        break;
      case 2:
        OS = parseOS(Comp);
        IsCygwin = Comp.startswith("cygwin");
        IsMinGW32 = Comp.startswith("mingw");
        Valid = OS != UnknownOS || IsCygwin || IsMinGW32;
        break;
      case 3:
        Environment = parseEnvironment(Comp);
        Valid = Environment != UnknownEnvironment;
        if (!Valid) {
          ObjectFormat = parseFormat(Comp);
          Valid = ObjectFormat != UnknownObjectFormat;
        }
        break;
      }
      if (!Valid)
        continue; // Nope, try the next component.

      // Move the component to the target position, pushing any non-fixed
      // components that are in the way to the right.  This tends to give
      // good results in the common cases of a forgotten vendor component
      // or a wrongly positioned environment.
      if (Pos < Idx) {
        // Insert left, pushing the existing components to the right.  For
        // example, a-b-i386 -> i386-a-b when moving i386 to the front.
        StringRef CurrentComponent(""); // The empty component.
        // Replace the component we are moving with an empty component.
        std::swap(CurrentComponent, Components[Idx]);
        // Insert the component being moved at Pos, displacing any existing
        // components to the right.
        for (unsigned i = Pos; !CurrentComponent.empty(); ++i) {
          // Skip over any fixed components.
          while (i < array_lengthof(Found) && Found[i])
            ++i;
          // Place the component at the new position, getting the component
          // that was at this position - it will be moved right.
          std::swap(CurrentComponent, Components[i]);
        }
      } else if (Pos > Idx) {
        // Push right by inserting empty components until the component at Idx
        // reaches the target position Pos.  For example, pc-a -> -pc-a when
        // moving pc to the second position.
        do {
          // Insert one empty component at Idx.
          StringRef CurrentComponent(""); // The empty component.
          for (unsigned i = Idx; i < Components.size();) {
            // Place the component at the new position, getting the component
            // that was at this position - it will be moved right.
            std::swap(CurrentComponent, Components[i]);
            // If it was placed on top of an empty component then we are done.
            if (CurrentComponent.empty())
              break;
            // Advance to the next component, skipping any fixed components.
            while (++i < array_lengthof(Found) && Found[i])
              ;
          }
          // The last component was pushed off the end - append it.
          if (!CurrentComponent.empty())
            Components.push_back(CurrentComponent);

          // Advance Idx to the component's new position.
          while (++Idx < array_lengthof(Found) && Found[Idx])
            ;
        } while (Idx < Pos); // Add more until the final position is reached.
      }
      assert(Pos < Components.size() && Components[Pos] == Comp &&
             "Component moved wrong!");
      Found[Pos] = true;
      break;
    }
  }

  // Special case logic goes here.  At this point Arch, Vendor and OS have the
  // correct values for the computed components.
  std::string NormalizedEnvironment;
  if (Environment == Triple::Android && Components[3].startswith("androideabi")) {
    StringRef AndroidVersion = Components[3].drop_front(strlen("androideabi"));
    if (AndroidVersion.empty()) {
      Components[3] = "android";
    } else {
      NormalizedEnvironment = Twine("android", AndroidVersion).str();
      Components[3] = NormalizedEnvironment;
    }
  }

  // SUSE uses "gnueabi" to mean "gnueabihf"
  if (Vendor == Triple::SUSE && Environment == llvm::Triple::GNUEABI)
    Components[3] = "gnueabihf";

  if (OS == Triple::Win32) {
    Components.resize(4);
    Components[2] = "windows";
    if (Environment == UnknownEnvironment) {
      if (ObjectFormat == UnknownObjectFormat || ObjectFormat == Triple::COFF)
        Components[3] = "msvc";
      else
        Components[3] = getObjectFormatTypeName(ObjectFormat);
    }
  } else if (IsMinGW32) {
    Components.resize(4);
    Components[2] = "windows";
    Components[3] = "gnu";
  } else if (IsCygwin) {
    Components.resize(4);
    Components[2] = "windows";
    Components[3] = "cygnus";
  }
  if (IsMinGW32 || IsCygwin ||
      (OS == Triple::Win32 && Environment != UnknownEnvironment)) {
    if (ObjectFormat != UnknownObjectFormat && ObjectFormat != Triple::COFF) {
      Components.resize(5);
      Components[4] = getObjectFormatTypeName(ObjectFormat);
    }
  }

  // Stick the corrected components back together to form the normalized string.
  std::string Normalized;
  for (unsigned i = 0, e = Components.size(); i != e; ++i) {
    if (i) Normalized += '-';
    Normalized += Components[i];
  }
  return Normalized;
}